

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O0

void canvas_reload(t_symbol *name,t_symbol *dir,_glist *except)

{
  int oldstate;
  _binbuf *local_38;
  _binbuf *b;
  _glist *p_Stack_28;
  int dspwas;
  _glist *x;
  _glist *except_local;
  t_symbol *dir_local;
  t_symbol *name_local;
  
  oldstate = canvas_suspend_dsp();
  local_38 = (_binbuf *)0x0;
  if (*(long *)(pd_maininstance.pd_gui)->i_editor != 0) {
    local_38 = binbuf_duplicate(*(_binbuf **)(pd_maininstance.pd_gui)->i_editor);
  }
  (pd_maininstance.pd_gui)->i_reloadingabstraction = except;
  for (p_Stack_28 = pd_getcanvaslist(); p_Stack_28 != (_glist *)0x0;
      p_Stack_28 = p_Stack_28->gl_next) {
    glist_doreload(p_Stack_28,name,dir,(t_gobj *)except);
  }
  (pd_maininstance.pd_gui)->i_reloadingabstraction = (_glist *)0x0;
  if (local_38 != (_binbuf *)0x0) {
    if (*(long *)(pd_maininstance.pd_gui)->i_editor != 0) {
      binbuf_free(*(_binbuf **)(pd_maininstance.pd_gui)->i_editor);
    }
    *(_binbuf **)(pd_maininstance.pd_gui)->i_editor = local_38;
  }
  canvas_resume_dsp(oldstate);
  return;
}

Assistant:

void canvas_reload(t_symbol *name, t_symbol *dir, t_glist *except)
{
    t_canvas *x;
    int dspwas = canvas_suspend_dsp();
    t_binbuf*b = 0;
    if(EDITOR->copy_binbuf)
        b = binbuf_duplicate(EDITOR->copy_binbuf);

    THISGUI->i_reloadingabstraction = except;
        /* find all root canvases */
    for (x = pd_getcanvaslist(); x; x = x->gl_next)
        glist_doreload(x, name, dir, &except->gl_gobj);
    THISGUI->i_reloadingabstraction = 0;
    if(b)
    {
        if(EDITOR->copy_binbuf)
            binbuf_free(EDITOR->copy_binbuf);
        EDITOR->copy_binbuf = b;
    }
    canvas_resume_dsp(dspwas);
}